

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O2

bool cmProjectCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar1;
  bool bVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  PolicyStatus PVar7;
  int iVar8;
  string *psVar9;
  cmValue cVar10;
  undefined7 extraout_var;
  char *value;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar11;
  uint uVar12;
  long lVar13;
  string *i;
  pointer pbVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ulong uVar15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view separator;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string_view value_09;
  string_view value_10;
  string_view value_11;
  string_view value_12;
  string_view value_13;
  string_view value_14;
  string_view value_15;
  string_view value_16;
  uint v [4];
  allocator_type local_32a;
  allocator<char> local_329;
  _Any_data local_328;
  code *local_318;
  code *pcStack_310;
  anon_class_8_1_0e9793f7 resetReporter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vv_1;
  string msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string version_string;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  version_components;
  RegularExpression vx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ulong local_98;
  string homepage;
  string description;
  string version;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vx,"PROJECT called with incorrect number of arguments",
               (allocator<char> *)&version_components);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&vx);
    return false;
  }
  this = status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vx,"CMAKE_PROJECT_INCLUDE_BEFORE",(allocator<char> *)&version_components);
  bVar4 = IncludeByVariable(status,(string *)&vx);
  std::__cxx11::string::~string((string *)&vx);
  if (!bVar4) {
    return false;
  }
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  std::operator+(version_components._M_elems,"CMAKE_PROJECT_",__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vx,
                 version_components._M_elems,"_INCLUDE_BEFORE");
  bVar4 = IncludeByVariable(status,(string *)&vx);
  std::__cxx11::string::~string((string *)&vx);
  std::__cxx11::string::~string((string *)&version_components);
  if (!bVar4) {
    return false;
  }
  cmMakefile::SetProjectName(this,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vx,__rhs,
                 "_BINARY_DIR");
  psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
  cmMakefile::AddCacheDefinition(this,(string *)&vx,psVar9,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::~string((string *)&vx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vx,__rhs,
                 "_SOURCE_DIR");
  psVar9 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
  cmMakefile::AddCacheDefinition(this,(string *)&vx,psVar9,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::~string((string *)&vx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vx,"PROJECT_BINARY_DIR",(allocator<char> *)&version_components);
  psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
  value_00._M_str = (psVar9->_M_dataplus)._M_p;
  value_00._M_len = psVar9->_M_string_length;
  cmMakefile::AddDefinition(this,(string *)&vx,value_00);
  std::__cxx11::string::~string((string *)&vx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vx,"PROJECT_SOURCE_DIR",(allocator<char> *)&version_components);
  psVar9 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
  value_01._M_str = (psVar9->_M_dataplus)._M_p;
  value_01._M_len = psVar9->_M_string_length;
  cmMakefile::AddDefinition(this,(string *)&vx,value_01);
  std::__cxx11::string::~string((string *)&vx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vx,"PROJECT_NAME",(allocator<char> *)&version_components);
  value_02._M_str = (__rhs->_M_dataplus)._M_p;
  value_02._M_len = __rhs->_M_string_length;
  cmMakefile::AddDefinition(this,(string *)&vx,value_02);
  std::__cxx11::string::~string((string *)&vx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vx,"PROJECT_IS_TOP_LEVEL",(allocator<char> *)&version_components);
  bVar4 = cmMakefile::IsRootMakefile(this);
  cmMakefile::AddDefinitionBool(this,(string *)&vx,bVar4);
  std::__cxx11::string::~string((string *)&vx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vx,__rhs,
                 "_IS_TOP_LEVEL");
  bVar4 = cmMakefile::IsRootMakefile(this);
  value = "OFF";
  if (bVar4) {
    value = "ON";
  }
  cmMakefile::AddCacheDefinition(this,(string *)&vx,value,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::~string((string *)&vx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vx,"CMAKE_PROJECT_NAME",(allocator<char> *)&version_components);
  cVar10 = cmMakefile::GetDefinition(this,(string *)&vx);
  if (cVar10.Value == (string *)0x0) {
    std::__cxx11::string::~string((string *)&vx);
LAB_002c43d5:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vx,"CMAKE_PROJECT_NAME",(allocator<char> *)&version_components);
    cmMakefile::RemoveDefinition(this,(string *)&vx);
    std::__cxx11::string::~string((string *)&vx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vx,"CMAKE_PROJECT_NAME",(allocator<char> *)&version_components);
    cmMakefile::AddCacheDefinition(this,(string *)&vx,__rhs,"Value Computed by CMake",STATIC,false);
    std::__cxx11::string::~string((string *)&vx);
  }
  else {
    bVar4 = cmMakefile::IsRootMakefile(this);
    std::__cxx11::string::~string((string *)&vx);
    if (bVar4) goto LAB_002c43d5;
  }
  version._M_dataplus._M_p = (pointer)&version.field_2;
  version._M_string_length = 0;
  description._M_dataplus._M_p = (pointer)&description.field_2;
  description._M_string_length = 0;
  version.field_2._M_local_buf[0] = '\0';
  description.field_2._M_local_buf[0] = '\0';
  homepage._M_dataplus._M_p = (pointer)&homepage.field_2;
  homepage._M_string_length = 0;
  local_98 = 0;
  homepage.field_2._M_local_buf[0] = '\0';
  languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  resetReporter.missedValueReporter = (function<void_()> *)&local_328;
  local_318 = (code *)0x0;
  pcStack_310 = (code *)0x0;
  local_328._M_unused._M_object = (cmMakefile *)0x0;
  local_328._8_8_ = (anon_class_8_1_0e9793f7 *)0x0;
  iVar8 = 2;
  lVar13 = 0x20;
  psVar9 = &msg;
  bVar2 = false;
  bVar1 = false;
  bVar6 = false;
  bVar4 = false;
  for (uVar15 = 1;
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5);
      uVar15 = uVar15 + 1) {
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar14->_M_dataplus)._M_p + lVar13),"LANGUAGES");
    if (bVar5) {
      if (bVar6) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vx,"LANGUAGES may be specified at most once.",
                   (allocator<char> *)&version_components);
        cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)&vx);
        goto LAB_002c4f28;
      }
      if (local_318 != (code *)0x0) {
        std::function<void_()>::operator()((function<void_()> *)&local_328);
      }
      bVar6 = true;
      if (languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        vx.regmatch.startp[0] = &DAT_00000044;
        vx.regmatch.startp[1] =
             "the following parameters must be specified after LANGUAGES keyword: ";
        separator._M_str = ", ";
        separator._M_len = 2;
        cmJoin(&version_string,&languages,separator,(string_view)ZEXT816(0));
        version_components._M_elems[0]._M_dataplus._M_p = (pointer)version_string._M_string_length;
        version_components._M_elems[0]._M_string_length = (size_type)version_string._M_dataplus._M_p
        ;
        v[0]._0_1_ = 0x2e;
        cmStrCat<char>(psVar9,(cmAlphaNum *)&vx,(cmAlphaNum *)&version_components,(char *)v);
        std::__cxx11::string::~string((string *)&version_string);
        cmMakefile::IssueMessage(this,WARNING,psVar9);
        std::__cxx11::string::~string((string *)psVar9);
      }
LAB_002c4615:
      iVar8 = 2;
    }
    else {
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar13),"VERSION");
      if (bVar5) {
        if (bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vx,"VERSION may be specified at most once.",
                     (allocator<char> *)&version_components);
          cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)&vx);
          goto LAB_002c4f28;
        }
        if (local_318 == (code *)0x0) {
          vx.regmatch.startp[2] = (char *)0x0;
        }
        else {
          std::function<void_()>::operator()((function<void_()> *)&local_328);
          vx.regmatch.startp[2] = (char *)local_318;
        }
        vx.regmatch.startp[0] = (char *)local_328._M_unused._0_8_;
        vx.regmatch.startp[1] = (char *)local_328._8_8_;
        local_328._8_8_ = &resetReporter;
        local_318 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:132:29)>
                    ::_M_manager;
        vx.regmatch.startp[3] = (char *)pcStack_310;
        pcStack_310 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:132:29)>
                      ::_M_invoke;
        local_328._M_unused._0_8_ = this;
        std::_Function_base::~_Function_base((_Function_base *)&vx);
        bVar4 = true;
        iVar8 = 3;
      }
      else {
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                         ._M_p + lVar13),"DESCRIPTION");
        if (bVar5) {
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vx,"DESCRIPTION may be specified at most once.",
                       (allocator<char> *)&version_components);
            cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)&vx);
            goto LAB_002c4f28;
          }
          if (local_318 == (code *)0x0) {
            vx.regmatch.startp[2] = (char *)0x0;
          }
          else {
            std::function<void_()>::operator()((function<void_()> *)&local_328);
            vx.regmatch.startp[2] = (char *)local_318;
          }
          vx.regmatch.startp[0] = (char *)local_328._M_unused._0_8_;
          vx.regmatch.startp[1] = (char *)local_328._8_8_;
          local_328._8_8_ = &resetReporter;
          local_318 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:151:29)>
                      ::_M_manager;
          vx.regmatch.startp[3] = (char *)pcStack_310;
          pcStack_310 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:151:29)>
                        ::_M_invoke;
          local_328._M_unused._0_8_ = this;
          std::_Function_base::~_Function_base((_Function_base *)&vx);
          bVar1 = true;
          iVar8 = 0;
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar13),"HOMEPAGE_URL");
          pcVar3 = local_318;
          if (bVar5) {
            if (bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vx,"HOMEPAGE_URL may be specified at most once.",
                         (allocator<char> *)&version_components);
              cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)&vx);
              goto LAB_002c4f28;
            }
            vx.regmatch.startp[0] = (char *)local_328._M_unused._0_8_;
            vx.regmatch.startp[1] = (char *)local_328._8_8_;
            local_328._8_8_ = &resetReporter;
            local_318 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:167:29)>
                        ::_M_manager;
            vx.regmatch.startp[2] = (char *)pcVar3;
            vx.regmatch.startp[3] = (char *)pcStack_310;
            pcStack_310 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:167:29)>
                          ::_M_invoke;
            local_328._M_unused._0_8_ = this;
            std::_Function_base::~_Function_base((_Function_base *)&vx);
            bVar2 = true;
            iVar8 = 1;
          }
          else {
            if ((uVar15 != 1) ||
               (bVar5 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 1,
                                        "__CMAKE_INJECTED_PROJECT_COMMAND__"), !bVar5)) {
              if (iVar8 == 0) {
                std::__cxx11::string::_M_assign((string *)&description);
              }
              else if (iVar8 == 1) {
                std::__cxx11::string::_M_assign((string *)&homepage);
              }
              else {
                if (iVar8 != 3) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&languages,
                              (value_type *)
                              ((long)&(((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar13));
                  iVar8 = 2;
                  goto LAB_002c47a4;
                }
                std::__cxx11::string::_M_assign((string *)&version);
              }
              cmProjectCommand::anon_class_8_1_0e9793f7::operator()(&resetReporter);
              goto LAB_002c4615;
            }
            local_98 = CONCAT71(extraout_var,1);
          }
        }
      }
    }
LAB_002c47a4:
    lVar13 = lVar13 + 0x20;
  }
  if (local_318 != (code *)0x0) {
    std::function<void_()>::operator()((function<void_()> *)&local_328);
  }
  if (((bVar4) || (bVar1)) || (bVar2)) {
    if (bVar6) goto LAB_002c48f9;
    if (languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002c49e4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vx,
               "project with VERSION, DESCRIPTION or HOMEPAGE_URL must use LANGUAGES before language names."
               ,(allocator<char> *)&version_components);
    cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)&vx);
LAB_002c4f28:
    std::__cxx11::string::~string((string *)&vx);
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar4 = true;
  }
  else {
    if (bVar6) {
LAB_002c48f9:
      if (languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[5]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&languages,
                   (char (*) [5])0x609a04);
      }
    }
LAB_002c49e4:
    PVar7 = cmMakefile::GetPolicyStatus(this,CMP0048,false);
    if (bVar4) {
      if (PVar7 < NEW) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vx,"VERSION not allowed unless CMP0048 is set to NEW",
                   (allocator<char> *)&version_components);
        cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)&vx);
        goto LAB_002c4f28;
      }
      cmsys::RegularExpression::RegularExpression
                (&vx,"^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
      bVar6 = cmsys::RegularExpression::find(&vx,version._M_dataplus._M_p);
      if (bVar6) {
        PVar7 = cmMakefile::GetPolicyStatus(this,CMP0096,false);
        version_string._M_dataplus._M_p = (pointer)&version_string.field_2;
        version_string._M_string_length = 0;
        version_string.field_2._M_local_buf[0] = '\0';
        this_00 = version_components._M_elems;
        std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
        ::array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 *)this_00);
        if (PVar7 < NEW) {
          v[0] = 0;
          v[1] = 0;
          v[2] = 0;
          v[3] = 0;
          iVar8 = __isoc99_sscanf(version._M_dataplus._M_p,"%u.%u.%u.%u",v,v + 1,v + 2,v + 3);
          for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
            if (lVar13 < iVar8) {
              snprintf((char *)psVar9,0xb,"%u",(ulong)v[lVar13]);
              std::__cxx11::string::append((char *)&version_string);
              std::__cxx11::string::append((char *)&version_string);
              std::__cxx11::string::assign((char *)this_00);
            }
            else {
              *(undefined1 *)&(psVar9->_M_dataplus)._M_p = 0;
            }
            psVar9 = (string *)((long)&psVar9->_M_string_length + 3);
            this_00 = this_00 + 1;
          }
        }
        else {
          std::__cxx11::string::operator=((string *)&version_string,(string *)&version);
          cmsys::SystemTools::SplitString
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&msg,&version_string,'.',false);
          for (uVar12 = 0; uVar15 = (ulong)uVar12,
              uVar15 < (ulong)((long)(msg._M_string_length - (long)msg._M_dataplus._M_p) >> 5);
              uVar12 = uVar12 + 1) {
            std::__cxx11::string::operator=
                      ((string *)(version_components._M_elems + uVar15),
                       (string *)(msg._M_dataplus._M_p + uVar15 * 0x20));
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&msg);
        }
        msg._M_dataplus._M_p = (pointer)&msg.field_2;
        msg._M_string_length = 0;
        msg.field_2._M_local_buf[0] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v,__rhs,
                       "_VERSION");
        std::__cxx11::string::operator=((string *)&msg,(string *)v);
        std::__cxx11::string::~string((string *)v);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)v,"PROJECT_VERSION",(allocator<char> *)&vv_1);
        value_03._M_str = version_string._M_dataplus._M_p;
        value_03._M_len = version_string._M_string_length;
        cmMakefile::AddDefinition(this,(string *)v,value_03);
        std::__cxx11::string::~string((string *)v);
        value_04._M_str = version_string._M_dataplus._M_p;
        value_04._M_len = version_string._M_string_length;
        cmMakefile::AddDefinition(this,&msg,value_04);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v,__rhs,
                       "_VERSION_MAJOR");
        std::__cxx11::string::operator=((string *)&msg,(string *)v);
        std::__cxx11::string::~string((string *)v);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)v,"PROJECT_VERSION_MAJOR",(allocator<char> *)&vv_1);
        value_05._M_str = version_components._M_elems[0]._M_dataplus._M_p;
        value_05._M_len = version_components._M_elems[0]._M_string_length;
        cmMakefile::AddDefinition(this,(string *)v,value_05);
        std::__cxx11::string::~string((string *)v);
        value_06._M_str = version_components._M_elems[0]._M_dataplus._M_p;
        value_06._M_len = version_components._M_elems[0]._M_string_length;
        cmMakefile::AddDefinition(this,&msg,value_06);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v,__rhs,
                       "_VERSION_MINOR");
        std::__cxx11::string::operator=((string *)&msg,(string *)v);
        std::__cxx11::string::~string((string *)v);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)v,"PROJECT_VERSION_MINOR",(allocator<char> *)&vv_1);
        value_07._M_str = version_components._M_elems[1]._M_dataplus._M_p;
        value_07._M_len = version_components._M_elems[1]._M_string_length;
        cmMakefile::AddDefinition(this,(string *)v,value_07);
        std::__cxx11::string::~string((string *)v);
        value_08._M_str = version_components._M_elems[1]._M_dataplus._M_p;
        value_08._M_len = version_components._M_elems[1]._M_string_length;
        cmMakefile::AddDefinition(this,&msg,value_08);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v,__rhs,
                       "_VERSION_PATCH");
        std::__cxx11::string::operator=((string *)&msg,(string *)v);
        std::__cxx11::string::~string((string *)v);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)v,"PROJECT_VERSION_PATCH",(allocator<char> *)&vv_1);
        value_09._M_str = version_components._M_elems[2]._M_dataplus._M_p;
        value_09._M_len = version_components._M_elems[2]._M_string_length;
        cmMakefile::AddDefinition(this,(string *)v,value_09);
        std::__cxx11::string::~string((string *)v);
        value_10._M_str = version_components._M_elems[2]._M_dataplus._M_p;
        value_10._M_len = version_components._M_elems[2]._M_string_length;
        cmMakefile::AddDefinition(this,&msg,value_10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v,__rhs,
                       "_VERSION_TWEAK");
        std::__cxx11::string::operator=((string *)&msg,(string *)v);
        std::__cxx11::string::~string((string *)v);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)v,"PROJECT_VERSION_TWEAK",(allocator<char> *)&vv_1);
        value_11._M_str = version_components._M_elems[3]._M_dataplus._M_p;
        value_11._M_len = version_components._M_elems[3]._M_string_length;
        cmMakefile::AddDefinition(this,(string *)v,value_11);
        std::__cxx11::string::~string((string *)v);
        value_12._M_str = version_components._M_elems[3]._M_dataplus._M_p;
        value_12._M_len = version_components._M_elems[3]._M_string_length;
        cmMakefile::AddDefinition(this,&msg,value_12);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)v,"CMAKE_PROJECT_VERSION",(allocator<char> *)&vv_1);
        TopLevelCMakeVarCondSet(this,(string *)v,&version_string);
        std::__cxx11::string::~string((string *)v);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)v,"CMAKE_PROJECT_VERSION_MAJOR",(allocator<char> *)&vv_1);
        TopLevelCMakeVarCondSet(this,(string *)v,version_components._M_elems);
        std::__cxx11::string::~string((string *)v);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)v,"CMAKE_PROJECT_VERSION_MINOR",(allocator<char> *)&vv_1);
        TopLevelCMakeVarCondSet(this,(string *)v,version_components._M_elems + 1);
        std::__cxx11::string::~string((string *)v);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)v,"CMAKE_PROJECT_VERSION_PATCH",(allocator<char> *)&vv_1);
        TopLevelCMakeVarCondSet(this,(string *)v,version_components._M_elems + 2);
        std::__cxx11::string::~string((string *)v);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)v,"CMAKE_PROJECT_VERSION_TWEAK",(allocator<char> *)&vv_1);
        TopLevelCMakeVarCondSet(this,(string *)v,version_components._M_elems + 3);
        std::__cxx11::string::~string((string *)v);
        std::__cxx11::string::~string((string *)&msg);
        std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
        ::~array(&version_components);
        psVar9 = &version_string;
      }
      else {
        std::operator+(&msg,"VERSION \"",&version);
        std::operator+(version_components._M_elems,&msg,"\" format invalid.");
        std::__cxx11::string::~string((string *)&msg);
        cmMakefile::IssueMessage(this,FATAL_ERROR,version_components._M_elems);
        cmSystemTools::s_FatalErrorOccurred = true;
        psVar9 = version_components._M_elems;
      }
      std::__cxx11::string::~string((string *)psVar9);
      cmsys::RegularExpression::~RegularExpression(&vx);
      bVar4 = true;
      if (!bVar6) goto LAB_002c4f42;
    }
    else if (PVar7 != OLD) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vx,"PROJECT_VERSION",(allocator<char> *)&version_components);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(vx.regmatch.startp + 4),"PROJECT_VERSION_MAJOR",(allocator<char> *)&msg)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(vx.regmatch.startp + 8),"PROJECT_VERSION_MINOR",
                 (allocator<char> *)&version_string);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(vx.regmatch.endp + 2),"PROJECT_VERSION_PATCH",(allocator<char> *)v);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(vx.regmatch.endp + 6),"PROJECT_VERSION_TWEAK",&local_329);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vx.regmatch.searchstring,__rhs,"_VERSION");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vx.program,__rhs,"_VERSION_MAJOR");
      std::operator+(&local_f8,__rhs,"_VERSION_MINOR");
      std::operator+(&local_d8,__rhs,"_VERSION_PATCH");
      std::operator+(&local_b8,__rhs,"_VERSION_TWEAK");
      __l._M_len = 10;
      __l._M_array = (iterator)&vx;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&vv_1,__l,&local_32a);
      lVar13 = 0x120;
      do {
        std::__cxx11::string::~string((string *)((long)vx.regmatch.startp + lVar13));
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != -0x20);
      bVar4 = cmMakefile::IsRootMakefile(this);
      uVar11 = extraout_RDX;
      if (bVar4) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv_1,
                   (char (*) [22])"CMAKE_PROJECT_VERSION");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[28]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv_1,
                   (char (*) [28])"CMAKE_PROJECT_VERSION_MAJOR");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[28]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv_1,
                   (char (*) [28])"CMAKE_PROJECT_VERSION_MINOR");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[28]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv_1,
                   (char (*) [28])"CMAKE_PROJECT_VERSION_PATCH");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[28]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv_1,
                   (char (*) [28])"CMAKE_PROJECT_VERSION_TWEAK");
        uVar11 = extraout_RDX_00;
      }
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      msg._M_string_length = 0;
      msg.field_2._M_local_buf[0] = '\0';
      for (pbVar14 = vv_1.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar14 !=
          vv_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
        cVar10 = cmMakefile::GetDefinition(this,pbVar14);
        uVar11 = extraout_RDX_01;
        if ((cVar10.Value != (string *)0x0) && ((cVar10.Value)->_M_string_length != 0)) {
          if (PVar7 == WARN) {
            if ((local_98 & 1) == 0) {
              std::__cxx11::string::append((char *)&msg);
              std::__cxx11::string::append((string *)&msg);
              uVar11 = extraout_RDX_02;
            }
          }
          else {
            cmMakefile::AddDefinition(this,pbVar14,(string_view)(ZEXT816(0x61ebb9) << 0x40));
            uVar11 = extraout_RDX_03;
          }
        }
      }
      if (msg._M_string_length != 0) {
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)v,(cmPolicies *)0x30,(PolicyID)uVar11);
        vx.regmatch.startp[0] = (char *)v._8_8_;
        vx.regmatch.startp[1] = (char *)v._0_8_;
        version_components._M_elems[0]._M_dataplus._M_p = (pointer)0x31;
        version_components._M_elems[0]._M_string_length = (size_type)anon_var_dwarf_c00a39;
        cmStrCat<std::__cxx11::string>
                  (&version_string,(cmAlphaNum *)&vx,(cmAlphaNum *)&version_components,&msg);
        cmMakefile::IssueMessage(this,AUTHOR_WARNING,&version_string);
        std::__cxx11::string::~string((string *)&version_string);
        std::__cxx11::string::~string((string *)v);
      }
      std::__cxx11::string::~string((string *)&msg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vv_1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vx,"PROJECT_DESCRIPTION",(allocator<char> *)&version_components);
    value_13._M_str = description._M_dataplus._M_p;
    value_13._M_len = description._M_string_length;
    cmMakefile::AddDefinition(this,(string *)&vx,value_13);
    std::__cxx11::string::~string((string *)&vx);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vx,__rhs,
                   "_DESCRIPTION");
    value_14._M_str = description._M_dataplus._M_p;
    value_14._M_len = description._M_string_length;
    cmMakefile::AddDefinition(this,(string *)&vx,value_14);
    std::__cxx11::string::~string((string *)&vx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vx,"CMAKE_PROJECT_DESCRIPTION",(allocator<char> *)&version_components);
    TopLevelCMakeVarCondSet(this,(string *)&vx,&description);
    std::__cxx11::string::~string((string *)&vx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vx,"PROJECT_HOMEPAGE_URL",(allocator<char> *)&version_components);
    value_15._M_str = homepage._M_dataplus._M_p;
    value_15._M_len = homepage._M_string_length;
    cmMakefile::AddDefinition(this,(string *)&vx,value_15);
    std::__cxx11::string::~string((string *)&vx);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vx,__rhs,
                   "_HOMEPAGE_URL");
    value_16._M_str = homepage._M_dataplus._M_p;
    value_16._M_len = homepage._M_string_length;
    cmMakefile::AddDefinition(this,(string *)&vx,value_16);
    std::__cxx11::string::~string((string *)&vx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vx,"CMAKE_PROJECT_HOMEPAGE_URL",(allocator<char> *)&version_components);
    TopLevelCMakeVarCondSet(this,(string *)&vx,&homepage);
    std::__cxx11::string::~string((string *)&vx);
    if (languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vx,"C",(allocator<char> *)&version_components);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(vx.regmatch.startp + 4),"CXX",(allocator<char> *)&msg);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&languages,&vx
                 ,vx.regmatch.startp + 8);
      lVar13 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)vx.regmatch.startp + lVar13));
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != -0x20);
    }
    cmMakefile::EnableLanguage(this,&languages,false);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vx,"CMAKE_PROJECT_INCLUDE",(allocator<char> *)&version_components);
    bVar4 = IncludeByVariable(status,(string *)&vx);
    std::__cxx11::string::~string((string *)&vx);
    if (bVar4) {
      std::operator+(version_components._M_elems,"CMAKE_PROJECT_",__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vx,
                     version_components._M_elems,"_INCLUDE");
      bVar4 = IncludeByVariable(status,(string *)&vx);
      std::__cxx11::string::~string((string *)&vx);
      std::__cxx11::string::~string((string *)&version_components);
    }
    else {
      bVar4 = false;
    }
  }
LAB_002c4f42:
  std::_Function_base::~_Function_base((_Function_base *)&local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&languages);
  std::__cxx11::string::~string((string *)&homepage);
  std::__cxx11::string::~string((string *)&description);
  std::__cxx11::string::~string((string *)&version);
  return bVar4;
}

Assistant:

bool cmProjectCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("PROJECT called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  if (!IncludeByVariable(status, "CMAKE_PROJECT_INCLUDE_BEFORE")) {
    return false;
  }

  std::string const& projectName = args[0];

  if (!IncludeByVariable(status,
                         "CMAKE_PROJECT_" + projectName + "_INCLUDE_BEFORE")) {
    return false;
  }

  mf.SetProjectName(projectName);

  mf.AddCacheDefinition(projectName + "_BINARY_DIR",
                        mf.GetCurrentBinaryDirectory(),
                        "Value Computed by CMake", cmStateEnums::STATIC);
  mf.AddCacheDefinition(projectName + "_SOURCE_DIR",
                        mf.GetCurrentSourceDirectory(),
                        "Value Computed by CMake", cmStateEnums::STATIC);

  mf.AddDefinition("PROJECT_BINARY_DIR", mf.GetCurrentBinaryDirectory());
  mf.AddDefinition("PROJECT_SOURCE_DIR", mf.GetCurrentSourceDirectory());

  mf.AddDefinition("PROJECT_NAME", projectName);

  mf.AddDefinitionBool("PROJECT_IS_TOP_LEVEL", mf.IsRootMakefile());
  mf.AddCacheDefinition(projectName + "_IS_TOP_LEVEL",
                        mf.IsRootMakefile() ? "ON" : "OFF",
                        "Value Computed by CMake", cmStateEnums::STATIC);

  // Set the CMAKE_PROJECT_NAME variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one, so that
  // CMAKE_PROJECT_NAME will match PROJECT_NAME, and cmake --build
  // will work.
  if (!mf.GetDefinition("CMAKE_PROJECT_NAME") || mf.IsRootMakefile()) {
    mf.RemoveDefinition("CMAKE_PROJECT_NAME");
    mf.AddCacheDefinition("CMAKE_PROJECT_NAME", projectName,
                          "Value Computed by CMake", cmStateEnums::STATIC);
  }

  bool haveVersion = false;
  bool haveLanguages = false;
  bool haveDescription = false;
  bool haveHomepage = false;
  bool injectedProjectCommand = false;
  std::string version;
  std::string description;
  std::string homepage;
  std::vector<std::string> languages;
  std::function<void()> missedValueReporter;
  auto resetReporter = [&missedValueReporter]() {
    missedValueReporter = std::function<void()>();
  };
  enum Doing
  {
    DoingDescription,
    DoingHomepage,
    DoingLanguages,
    DoingVersion
  };
  Doing doing = DoingLanguages;
  for (size_t i = 1; i < args.size(); ++i) {
    if (args[i] == "LANGUAGES") {
      if (haveLanguages) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "LANGUAGES may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveLanguages = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingLanguages;
      if (!languages.empty()) {
        std::string msg = cmStrCat(
          "the following parameters must be specified after LANGUAGES "
          "keyword: ",
          cmJoin(languages, ", "), '.');
        mf.IssueMessage(MessageType::WARNING, msg);
      }
    } else if (args[i] == "VERSION") {
      if (haveVersion) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "VERSION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveVersion = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingVersion;
      missedValueReporter = [&mf, &resetReporter]() {
        mf.IssueMessage(
          MessageType::WARNING,
          "VERSION keyword not followed by a value or was followed by a "
          "value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "DESCRIPTION") {
      if (haveDescription) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "DESCRIPTION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveDescription = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingDescription;
      missedValueReporter = [&mf, &resetReporter]() {
        mf.IssueMessage(
          MessageType::WARNING,
          "DESCRIPTION keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "HOMEPAGE_URL") {
      if (haveHomepage) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "HOMEPAGE_URL may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveHomepage = true;
      doing = DoingHomepage;
      missedValueReporter = [&mf, &resetReporter]() {
        mf.IssueMessage(
          MessageType::WARNING,
          "HOMEPAGE_URL keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (i == 1 && args[i] == "__CMAKE_INJECTED_PROJECT_COMMAND__") {
      injectedProjectCommand = true;
    } else if (doing == DoingVersion) {
      doing = DoingLanguages;
      version = args[i];
      resetReporter();
    } else if (doing == DoingDescription) {
      doing = DoingLanguages;
      description = args[i];
      resetReporter();
    } else if (doing == DoingHomepage) {
      doing = DoingLanguages;
      homepage = args[i];
      resetReporter();
    } else // doing == DoingLanguages
    {
      languages.push_back(args[i]);
    }
  }

  if (missedValueReporter) {
    missedValueReporter();
  }

  if ((haveVersion || haveDescription || haveHomepage) && !haveLanguages &&
      !languages.empty()) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "project with VERSION, DESCRIPTION or HOMEPAGE_URL must "
                    "use LANGUAGES before language names.");
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }
  if (haveLanguages && languages.empty()) {
    languages.emplace_back("NONE");
  }

  cmPolicies::PolicyStatus const cmp0048 =
    mf.GetPolicyStatus(cmPolicies::CMP0048);
  if (haveVersion) {
    // Set project VERSION variables to given values
    if (cmp0048 == cmPolicies::OLD || cmp0048 == cmPolicies::WARN) {
      mf.IssueMessage(MessageType::FATAL_ERROR,
                      "VERSION not allowed unless CMP0048 is set to NEW");
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }

    cmsys::RegularExpression vx(
      R"(^([0-9]+(\.[0-9]+(\.[0-9]+(\.[0-9]+)?)?)?)?$)");
    if (!vx.find(version)) {
      std::string e = R"(VERSION ")" + version + R"(" format invalid.)";
      mf.IssueMessage(MessageType::FATAL_ERROR, e);
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }

    cmPolicies::PolicyStatus const cmp0096 =
      mf.GetPolicyStatus(cmPolicies::CMP0096);

    constexpr std::size_t MAX_VERSION_COMPONENTS = 4u;
    std::string version_string;
    std::array<std::string, MAX_VERSION_COMPONENTS> version_components;

    if (cmp0096 == cmPolicies::OLD || cmp0096 == cmPolicies::WARN) {
      constexpr size_t maxIntLength =
        std::numeric_limits<unsigned>::digits10 + 2;
      char vb[MAX_VERSION_COMPONENTS][maxIntLength];
      unsigned v[MAX_VERSION_COMPONENTS] = { 0, 0, 0, 0 };
      const int vc = std::sscanf(version.c_str(), "%u.%u.%u.%u", &v[0], &v[1],
                                 &v[2], &v[3]);
      for (auto i = 0u; i < MAX_VERSION_COMPONENTS; ++i) {
        if (static_cast<int>(i) < vc) {
          std::snprintf(vb[i], maxIntLength, "%u", v[i]);
          version_string += &"."[static_cast<std::size_t>(i == 0)];
          version_string += vb[i];
          version_components[i] = vb[i];
        } else {
          vb[i][0] = '\x00';
        }
      }
    } else {
      // The regex above verified that we have a .-separated string of
      // non-negative integer components.  Keep the original string.
      version_string = std::move(version);
      // Split the integer components.
      auto components = cmSystemTools::SplitString(version_string, '.');
      for (auto i = 0u; i < components.size(); ++i) {
        version_components[i] = std::move(components[i]);
      }
    }

    std::string vv;
    vv = projectName + "_VERSION";
    mf.AddDefinition("PROJECT_VERSION", version_string);
    mf.AddDefinition(vv, version_string);
    vv = projectName + "_VERSION_MAJOR";
    mf.AddDefinition("PROJECT_VERSION_MAJOR", version_components[0]);
    mf.AddDefinition(vv, version_components[0]);
    vv = projectName + "_VERSION_MINOR";
    mf.AddDefinition("PROJECT_VERSION_MINOR", version_components[1]);
    mf.AddDefinition(vv, version_components[1]);
    vv = projectName + "_VERSION_PATCH";
    mf.AddDefinition("PROJECT_VERSION_PATCH", version_components[2]);
    mf.AddDefinition(vv, version_components[2]);
    vv = projectName + "_VERSION_TWEAK";
    mf.AddDefinition("PROJECT_VERSION_TWEAK", version_components[3]);
    mf.AddDefinition(vv, version_components[3]);
    // Also, try set top level variables
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION", version_string);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_MAJOR",
                            version_components[0]);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_MINOR",
                            version_components[1]);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_PATCH",
                            version_components[2]);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_TWEAK",
                            version_components[3]);
  } else if (cmp0048 != cmPolicies::OLD) {
    // Set project VERSION variables to empty
    std::vector<std::string> vv = { "PROJECT_VERSION",
                                    "PROJECT_VERSION_MAJOR",
                                    "PROJECT_VERSION_MINOR",
                                    "PROJECT_VERSION_PATCH",
                                    "PROJECT_VERSION_TWEAK",
                                    projectName + "_VERSION",
                                    projectName + "_VERSION_MAJOR",
                                    projectName + "_VERSION_MINOR",
                                    projectName + "_VERSION_PATCH",
                                    projectName + "_VERSION_TWEAK" };
    if (mf.IsRootMakefile()) {
      vv.emplace_back("CMAKE_PROJECT_VERSION");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MAJOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MINOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_PATCH");
      vv.emplace_back("CMAKE_PROJECT_VERSION_TWEAK");
    }
    std::string vw;
    for (std::string const& i : vv) {
      cmValue v = mf.GetDefinition(i);
      if (cmNonempty(v)) {
        if (cmp0048 == cmPolicies::WARN) {
          if (!injectedProjectCommand) {
            vw += "\n  ";
            vw += i;
          }
        } else {
          mf.AddDefinition(i, "");
        }
      }
    }
    if (!vw.empty()) {
      mf.IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0048),
                 "\nThe following variable(s) would be set to empty:", vw));
    }
  }

  mf.AddDefinition("PROJECT_DESCRIPTION", description);
  mf.AddDefinition(projectName + "_DESCRIPTION", description);
  TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_DESCRIPTION", description);

  mf.AddDefinition("PROJECT_HOMEPAGE_URL", homepage);
  mf.AddDefinition(projectName + "_HOMEPAGE_URL", homepage);
  TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_HOMEPAGE_URL", homepage);

  if (languages.empty()) {
    // if no language is specified do c and c++
    languages = { "C", "CXX" };
  }
  mf.EnableLanguage(languages, false);

  if (!IncludeByVariable(status, "CMAKE_PROJECT_INCLUDE")) {
    return false;
  }

  if (!IncludeByVariable(status,
                         "CMAKE_PROJECT_" + projectName + "_INCLUDE")) {
    return false;
  }

  return true;
}